

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

void player_handle_post_move(player *p,_Bool eval_trap,_Bool is_involuntary)

{
  wchar_t *pwVar1;
  uint32_t *puVar2;
  bitflag *flags;
  loc grid;
  loc grid_00;
  loc grid_01;
  loc grid_02;
  loc grid_03;
  loc grid_04;
  loc grid_05;
  loc grid_06;
  _Bool _Var3;
  int iVar4;
  wchar_t index;
  char *fl;
  
  grid.x = (p->grid).x;
  grid.y = (p->grid).y;
  _Var3 = square_isshop(cave,grid);
  if (_Var3) {
    iVar4 = strcmp(p->shape->name,"normal");
    if (iVar4 != 0) {
      grid_00.x = (p->grid).x;
      grid_00.y = (p->grid).y;
      index = square_shopnum(cave,grid_00);
      _Var3 = index_is_home(index);
      if (!_Var3) {
        msg("There is a scream and the door slams shut!");
        return;
      }
    }
    disturb(p);
    if (is_involuntary) {
      cmdq_flush();
    }
    event_signal(EVENT_ENTER_STORE);
    event_remove_handler_type(EVENT_ENTER_STORE);
    event_signal(EVENT_USE_STORE);
    event_remove_handler_type(EVENT_USE_STORE);
    event_signal(EVENT_LEAVE_STORE);
    event_remove_handler_type(EVENT_LEAVE_STORE);
  }
  else {
    if (is_involuntary) {
      cmdq_flush();
    }
    grid_01.x = (p->grid).x;
    grid_01.y = (p->grid).y;
    square_know_pile(cave,grid_01,(_func__Bool_object_ptr *)0x0);
  }
  grid_02.x = (p->grid).x;
  grid_02.y = (p->grid).y;
  _Var3 = square_istree(cave,grid_02);
  if (_Var3) {
    flags = (p->state).pflags;
    _Var3 = flag_has_dbg(flags,10,0x13,"p->state.pflags","(PF_WOODEN)");
    if (_Var3) goto LAB_001c2a58;
    _Var3 = flag_has_dbg(flags,10,0x30,"p->state.pflags","(PF_WOODSMAN)");
    if (_Var3) goto LAB_001c2a58;
    _Var3 = flag_has_dbg(flags,10,0x11,"p->state.pflags","(PF_FLYING)");
    if (_Var3) goto LAB_001c2a58;
    fl = "(PF_ELVEN)";
    iVar4 = 0x16;
  }
  else {
    grid_03.x = (p->grid).x;
    grid_03.y = (p->grid).y;
    _Var3 = square_isrubble(cave,grid_03);
    if (!_Var3) goto LAB_001c2a58;
    _Var3 = flag_has_dbg((p->state).pflags,10,0x17,"p->state.pflags","(PF_DWARVEN)");
    if (_Var3) goto LAB_001c2a58;
    fl = "(PF_FLYING)";
    iVar4 = 0x11;
  }
  _Var3 = flag_has_dbg((p->state).pflags,10,iVar4,"p->state.pflags",fl);
  if (!_Var3) {
    pwVar1 = &p->upkeep->energy_use;
    *pwVar1 = *pwVar1 + (uint)z_info->move_energy;
  }
LAB_001c2a58:
  puVar2 = &player->upkeep->update;
  *puVar2 = *puVar2 | 1;
  if (eval_trap) {
    grid_04.x = (p->grid).x;
    grid_04.y = (p->grid).y;
    _Var3 = square_isplayertrap(cave,grid_04);
    if (_Var3) {
      grid_05.x = (p->grid).x;
      grid_05.y = (p->grid).y;
      _Var3 = square_isdisabledtrap(cave,grid_05);
      if (!_Var3) {
        grid_06.x = (p->grid).x;
        grid_06.y = (p->grid).y;
        hit_trap(grid_06,L'\0');
      }
    }
  }
  update_view(cave,p);
  search(p);
  return;
}

Assistant:

void player_handle_post_move(struct player *p, bool eval_trap,
		bool is_involuntary)
{
	/* Handle store doors, or notice objects */
	if (square_isshop(cave, p->grid)) {
		if ((player_is_shapechanged(p) &&
			 !index_is_home(square_shopnum(cave, p->grid)))) {
			msg("There is a scream and the door slams shut!");
			return;
		}
		disturb(p);
		if (is_involuntary) {
			cmdq_flush();
		}
		event_signal(EVENT_ENTER_STORE);
		event_remove_handler_type(EVENT_ENTER_STORE);
		event_signal(EVENT_USE_STORE);
		event_remove_handler_type(EVENT_USE_STORE);
		event_signal(EVENT_LEAVE_STORE);
		event_remove_handler_type(EVENT_LEAVE_STORE);
	} else {
		if (is_involuntary) {
			cmdq_flush();
		}
		square_know_pile(cave, p->grid, NULL);
	}

	/* Some terrain types need special treatment */
	if (square_istree(cave, p->grid)) {
		/* Ents, elves, druids, rangers, flyers can move easily */
		if (!(player_has(p, PF_WOODEN) || player_has(p, PF_WOODSMAN) ||
			  player_has(p, PF_FLYING) || player_has(p, PF_ELVEN))) {
			p->upkeep->energy_use += z_info->move_energy;
		}
	} else if (square_isrubble(cave, p->grid)) {
		/* Dwarves, flyers can move easily */
		if (!(player_has(p, PF_DWARVEN) ||
			  player_has(p, PF_FLYING))) {
			p->upkeep->energy_use += z_info->move_energy;
		}
	}

	/* Speed or stealth may change */
	player->upkeep->update |= (PU_BONUS);

	/* Discover invisible traps, set off visible ones */
	if (eval_trap && square_isplayertrap(cave, p->grid)
			&& !square_isdisabledtrap(cave, p->grid)) {
		hit_trap(p->grid, 0);
	}

	/* Update view and search */
	update_view(cave, p);
	search(p);
}